

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O2

void presolve::dev_kkt_check::checkPrimalFeasMatrix(State *state,KktConditionDetails *details)

{
  double dVar1;
  ostream *poVar2;
  char *pcVar3;
  int i;
  long lVar4;
  double dVar5;
  double dVar6;
  
  details->type = kPrimalFeasibility;
  details->max_violation = 0.0;
  details->sum_violation_2 = 0.0;
  details->checked = 0;
  details->violated = 0;
  for (lVar4 = 0; lVar4 < state->numRow; lVar4 = lVar4 + 1) {
    if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar4] != 0) {
      details->checked = details->checked + 1;
      dVar1 = (state->rowValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      dVar6 = (state->rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      if ((dVar1 <= dVar6) ||
         ((state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar4] <= dVar1)) {
        dVar5 = 0.0;
        if ((dVar1 < dVar6) && (1e-07 < ABS(dVar1 - dVar6))) {
          dVar5 = dVar6 - dVar1;
          poVar2 = std::operator<<((ostream *)&std::cout,"Row ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar4);
          std::operator<<(poVar2," infeasible: Row value=");
          poVar2 = std::ostream::_M_insert<double>(dVar1);
          std::operator<<(poVar2,"  L=");
          poVar2 = std::ostream::_M_insert<double>
                             ((state->rowLower->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar4]);
          std::operator<<(poVar2,"  U=");
          poVar2 = std::ostream::_M_insert<double>
                             ((state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar4]);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        dVar6 = (state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        if ((dVar6 < dVar1) && (dVar6 = dVar1 - dVar6, 1e-07 < ABS(dVar6))) {
          poVar2 = std::operator<<((ostream *)&std::cout,"Row ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar4);
          std::operator<<(poVar2," infeasible: Row value=");
          poVar2 = std::ostream::_M_insert<double>(dVar1);
          std::operator<<(poVar2,"  L=");
          poVar2 = std::ostream::_M_insert<double>
                             ((state->rowLower->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar4]);
          std::operator<<(poVar2,"  U=");
          poVar2 = std::ostream::_M_insert<double>
                             ((state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar4]);
          std::endl<char,std::char_traits<char>>(poVar2);
          dVar5 = dVar6;
        }
        if (0.0 < dVar5) {
          details->violated = details->violated + 1;
          details->sum_violation_2 = dVar5 * dVar5 + details->sum_violation_2;
          if (details->max_violation <= dVar5 && dVar5 != details->max_violation) {
            details->max_violation = dVar5;
          }
        }
      }
    }
  }
  pcVar3 = "KKT check error: Primal infeasible.\n";
  if (details->violated == 0) {
    pcVar3 = "Primal feasible.\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar3);
  return;
}

Assistant:

void checkPrimalFeasMatrix(const State& state, KktConditionDetails& details) {
  details.type = KktCondition::kPrimalFeasibility;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;
      double rowV = state.rowValue[i];

      if (state.rowLower[i] < rowV && rowV < state.rowUpper[i]) continue;
      double infeas = 0;

      if (((rowV - state.rowLower[i]) < 0) &&
          (fabs(rowV - state.rowLower[i]) > tol)) {
        infeas = state.rowLower[i] - rowV;
        if (dev_print == 1)
          std::cout << "Row " << i << " infeasible: Row value=" << rowV
                    << "  L=" << state.rowLower[i]
                    << "  U=" << state.rowUpper[i] << std::endl;
      }

      if (((rowV - state.rowUpper[i]) > 0) &&
          (fabs(rowV - state.rowUpper[i]) > tol)) {
        infeas = rowV - state.rowUpper[i];
        if (dev_print == 1)
          std::cout << "Row " << i << " infeasible: Row value=" << rowV
                    << "  L=" << state.rowLower[i]
                    << "  U=" << state.rowUpper[i] << std::endl;
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Primal feasible.\n";
  } else {
    if (dev_print == 1) std::cout << "KKT check error: Primal infeasible.\n";
  }
}